

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_negotiate(telnet_t *telnet,uchar cmd,uchar telopt)

{
  ushort uVar1;
  ushort uVar2;
  byte bVar3;
  byte us;
  ulong uVar4;
  uchar bytes [3];
  char local_3b [3];
  telnet_event_t local_38;
  
  if ((telnet->flags & 1) != 0) {
    local_3b[1] = cmd;
    local_3b[0] = 0xff;
LAB_001027a1:
    local_38.data.buffer = local_3b;
    local_38.type = TELNET_EV_SEND;
    local_38.data.size = 3;
    local_3b[2] = telopt;
    (*telnet->eh)(telnet,&local_38,telnet->ud);
    return;
  }
  if ((ulong)telnet->q_cnt != 0) {
    uVar4 = 0;
    do {
      if (telnet->q[uVar4].telopt == telopt) {
        uVar1 = (ushort)telnet->q[uVar4].state << 8;
        goto LAB_001027d4;
      }
      uVar4 = uVar4 + 1;
    } while (telnet->q_cnt != uVar4);
  }
  uVar1 = 0;
LAB_001027d4:
  if (3 < cmd - 0xfb) {
    return;
  }
  uVar2 = uVar1 >> 8;
  bVar3 = (byte)(uVar1 >> 8);
  switch((uint)cmd) {
  case 0xfb:
    if ((uVar2 & 0xf) == 5) {
      bVar3 = bVar3 >> 4;
      us = 3;
    }
    else {
      if ((uVar2 & 0xf) != 2) {
        if ((uVar2 & 0xf) != 0) {
          return;
        }
        _set_rfc1143(telnet,telopt,'\x03',bVar3 >> 4);
        local_3b[0] = -1;
        local_3b[1] = -5;
        goto LAB_001027a1;
      }
      bVar3 = bVar3 >> 4;
      us = 4;
    }
    break;
  case 0xfc:
    uVar2 = uVar2 & 0xf;
    if (uVar2 == 4) {
      bVar3 = bVar3 >> 4;
      us = 2;
    }
    else {
      if (uVar2 != 3) {
        if (uVar2 != 1) {
          return;
        }
        _set_rfc1143(telnet,telopt,'\x02',bVar3 >> 4);
        local_3b[0] = -1;
        local_3b[1] = -4;
        goto LAB_001027a1;
      }
      bVar3 = bVar3 >> 4;
      us = 5;
    }
    break;
  case 0xfd:
    uVar1 = uVar1 >> 0xc;
    if (uVar1 == 5) {
      us = bVar3 & 0xf;
      bVar3 = 3;
    }
    else {
      if (uVar1 != 2) {
        if (uVar1 != 0) {
          return;
        }
        _set_rfc1143(telnet,telopt,bVar3 & 0xf,'\x03');
        local_3b[0] = -1;
        local_3b[1] = -3;
        goto LAB_001027a1;
      }
      us = bVar3 & 0xf;
      bVar3 = 4;
    }
    break;
  case 0xfe:
    uVar1 = uVar1 >> 0xc;
    if (uVar1 == 4) {
      us = bVar3 & 0xf;
      bVar3 = 2;
    }
    else {
      if (uVar1 != 3) {
        if (uVar1 != 1) {
          return;
        }
        _set_rfc1143(telnet,telopt,bVar3 & 0xf,'\x02');
        local_3b[0] = -1;
        local_3b[1] = -2;
        goto LAB_001027a1;
      }
      us = bVar3 & 0xf;
      bVar3 = 5;
    }
  }
  _set_rfc1143(telnet,telopt,us,bVar3);
  return;
}

Assistant:

void telnet_negotiate(telnet_t *telnet, unsigned char cmd,
		unsigned char telopt) {
	telnet_rfc1143_t q;

	/* if we're in proxy mode, just send it now */
	if (telnet->flags & TELNET_FLAG_PROXY) {
		unsigned char bytes[3];
		bytes[0] = TELNET_IAC;
		bytes[1] = cmd;
		bytes[2] = telopt;
		_sendu(telnet, bytes, 3);
		return;
	}

	/* get current option states */
	q = _get_rfc1143(telnet, telopt);

	switch (cmd) {
	/* advertise willingess to support an option */
	case TELNET_WILL:
		switch (Q_US(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			_send_negotiate(telnet, TELNET_WILL, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_WANTNO_OP, Q_HIM(q));
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			break;
		}
		break;

	/* force turn-off of locally enabled option */
	case TELNET_WONT:
		switch (Q_US(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			_send_negotiate(telnet, TELNET_WONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_WANTYES_OP, Q_HIM(q));
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			break;
		}
		break;

	/* ask remote end to enable an option */
	case TELNET_DO:
		switch (Q_HIM(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			_send_negotiate(telnet, TELNET_DO, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO_OP);
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			break;
		}
		break;

	/* demand remote end disable an option */
	case TELNET_DONT:
		switch (Q_HIM(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			_send_negotiate(telnet, TELNET_DONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES_OP);
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			break;
		}
		break;
	}
}